

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qclipboard.cpp
# Opt level: O3

QString * __thiscall
QClipboard::text(QString *__return_storage_ptr__,QClipboard *this,QString *subtype,Mode mode)

{
  Interface *pIVar1;
  char16_t *pcVar2;
  QString *pQVar3;
  char cVar4;
  int iVar5;
  undefined4 extraout_var;
  long *plVar6;
  qsizetype qVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  QLatin1String QVar10;
  QByteArrayView QVar11;
  QLatin1String QVar12;
  QLatin1String QVar13;
  QByteArrayView in;
  QStringBuilder<QLatin1String,_QString_&> local_d0;
  QArrayData *local_b8;
  storage_type *psStack_b0;
  undefined1 *local_a8;
  QArrayDataPointer<QString> local_98;
  undefined1 local_78 [8];
  char16_t *pcStack_70;
  QString *pQStack_68;
  qsizetype local_60;
  anon_union_16_2_cfafc8b3_for_State_4 aStack_58;
  ClearDataFn p_Stack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xe])();
  plVar6 = (long *)CONCAT44(extraout_var,iVar5);
  cVar4 = (**(code **)(*plVar6 + 0x20))(plVar6,mode);
  if ((cVar4 == '\0') ||
     (plVar6 = (long *)(**(code **)(*plVar6 + 0x10))(plVar6,mode), plVar6 == (long *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_002bbdd0;
  }
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d._0_4_ = 0xaaaaaaaa;
  local_98.d._4_4_ = 0xaaaaaaaa;
  local_98.ptr._0_4_ = 0xaaaaaaaa;
  local_98.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*plVar6 + 0x68))(&local_98,plVar6);
  if ((subtype->d).size == 0) {
    QVar12.m_data = "text/plain";
    QVar12.m_size = 10;
    cVar4 = QtPrivate::QStringList_contains((QList_conflict *)&local_98,QVar12,CaseSensitive);
    if (cVar4 == '\0') {
      if ((undefined1 *)local_98.size != (undefined1 *)0x0) {
        lVar9 = CONCAT44(local_98.ptr._4_4_,local_98.ptr._0_4_);
        lVar8 = local_98.size * 0x18;
        do {
          QVar10.m_data = &DAT_00000005;
          QVar10.m_size = lVar9;
          cVar4 = QString::startsWith(QVar10,0x67ebeb);
          if (cVar4 != '\0') {
            QString::QString((QString *)local_78,(QChar *)(*(long *)(lVar9 + 8) + 10),
                             *(long *)(lVar9 + 0x10) + -5);
            pIVar1 = (Interface *)(subtype->d).d;
            pcVar2 = (subtype->d).ptr;
            (subtype->d).d = (Data *)local_78;
            (subtype->d).ptr = pcStack_70;
            pQVar3 = (QString *)(subtype->d).size;
            (subtype->d).size = (qsizetype)pQStack_68;
            local_78 = (undefined1  [8])pIVar1;
            pcStack_70 = pcVar2;
            pQStack_68 = pQVar3;
            if (pIVar1 != (Interface *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&pIVar1->name)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&pIVar1->name)->_q_value).super___atomic_base<int>._M_i + -1
              ;
              UNLOCK();
              if ((((QBasicAtomicInt *)&pIVar1->name)->_q_value).super___atomic_base<int>._M_i == 0)
              {
                QArrayData::deallocate((QArrayData *)pIVar1,2,0x10);
              }
            }
            break;
          }
          lVar9 = lVar9 + 0x18;
          lVar8 = lVar8 + -0x18;
        } while (lVar8 != 0);
      }
      if ((subtype->d).size == 0) goto LAB_002bbd90;
    }
    else {
      QVar13.m_data = "plain";
      QVar13.m_size = 5;
      QString::operator=(subtype,QVar13);
    }
LAB_002bbc98:
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    psStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_d0.a.m_size = 5;
    local_d0.a.m_data = "text/";
    local_d0.b = subtype;
    QStringBuilder<QLatin1String,_QString_&>::convertTo<QString>((QString *)local_78,&local_d0);
    QMimeData::data((QString *)&local_b8);
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    QVar11.m_data = psStack_b0;
    QVar11.m_size = (qsizetype)local_a8;
    lVar8 = QStringConverter::encodingForData(QVar11,L'\0');
    local_78 = (undefined1  [8])
               (&QStringConverter::encodingInterfaces +
               (ulong)((uint)((lVar8 << 0x1f) >> 0x3f) & (uint)lVar8) * 5);
    pcStack_70 = (char16_t *)0x0;
    pQStack_68 = (QString *)0x0;
    local_60 = 0;
    aStack_58.d[0] = (void *)0x0;
    aStack_58.d[1] = (void *)0x0;
    p_Stack_48 = (ClearDataFn)0x0;
    in.m_data = psStack_b0;
    in.m_size = (qsizetype)local_a8;
    QStringDecoder::decodeAsString(__return_storage_ptr__,(QStringDecoder *)local_78,in);
    QStringConverterBase::State::clear();
    if (local_b8 != (QArrayData *)0x0) {
      LOCK();
      (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b8,1,0x10);
      }
    }
  }
  else {
    local_78 = (undefined1  [8])&DAT_00000005;
    pcStack_70 = L"text/";
    pQStack_68 = subtype;
    qVar7 = QtPrivate::indexOf<QString,QStringBuilder<QLatin1String,QString&>>
                      ((QList<QString> *)&local_98,
                       (QStringBuilder<QLatin1String,_QString_&> *)local_78,0);
    if (qVar7 != -1) goto LAB_002bbc98;
LAB_002bbd90:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_002bbdd0:
  __stack_chk_fail();
}

Assistant:

QString QClipboard::text(QString &subtype, Mode mode) const
{
    const QMimeData *const data = mimeData(mode);
    if (!data)
        return QString();

    const QStringList formats = data->formats();
    if (subtype.isEmpty()) {
        if (formats.contains("text/plain"_L1))
            subtype = "plain"_L1;
        else {
            for (const auto &format : formats) {
                if (format.startsWith("text/"_L1)) {
                    subtype = format.sliced(5);
                    break;
                }
            }
            if (subtype.isEmpty())
                return QString();
        }
    } else if (!formats.contains("text/"_L1 + subtype)) {
        return QString();
    }

    const QByteArray rawData = data->data("text/"_L1 + subtype);
    auto encoding = QStringConverter::encodingForData(rawData);
    if (!encoding)
        encoding = QStringConverter::Utf8;
    return QStringDecoder(*encoding).decode(rawData);
}